

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.h
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
mvm::assembler<mvm::test::test_instr_set,mvm::bytecode_serializer>::
assemble_instr<mvm::instr_set<mvm::test::test_instr_set>::consumer_producer_pipe<mvm::meta_tie<mvm::meta_bytecode,unsigned_int>,mvm::meta_tie<mvm::meta_value_stack,unsigned_int>,mvm::typestring::type_string<(char)112,(char)117,(char)115,(char)104,(char)0>>>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,void *this,
          uint8_t i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *attributes)

{
  string *str;
  array<unsigned_char,_4UL> aVar1;
  undefined8 *puVar2;
  initializer_list<unsigned_char> __l;
  array<unsigned_char,_4UL> ser;
  allocator_type local_41;
  undefined8 local_40;
  undefined1 local_30 [16];
  
  local_40 = (undefined1 *)CONCAT71(local_40._1_7_,i);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_40;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__l,&local_41);
  str = (attributes->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(attributes->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)str == 0x20) {
    aVar1 = num::serial<unsigned_int,4ul,mvm::num::little_endian_tag>(str);
    local_40 = (undefined1 *)CONCAT44(local_40._4_4_,aVar1._M_elems);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((uchar *)&local_40,(uchar *)((long)&local_40 + 4),
               (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
               __return_storage_ptr__);
    return __return_storage_ptr__;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"[-][mvm] invalid instruction operands","");
  *puVar2 = &PTR__mexcept_00183098;
  *(undefined2 *)(puVar2 + 1) = 4;
  __cxa_throw(puVar2,&mexcept::typeinfo,mexcept::~mexcept);
}

Assistant:

std::vector<uint8_t> assembler<Set, MetaCodeImpl>::assemble_instr(
    uint8_t i, std::vector<std::string> const &attributes) const {
  std::vector<uint8_t> bytes = {i};

  if constexpr (concept ::is_code_consumer<I>()) {
    using cc_type = typename I::bytecode_type;

    if (attributes.size() != list::size_v<cc_type>) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }

    assemble_operands<I>(bytes, attributes,
                         std::make_index_sequence<list::size_v<cc_type>>());
  } else {
    if (attributes.size() != 0) {
      throw mexcept("[-][mvm] invalid instruction operands",
                    status_type::BAD_INSTR_OPERAND);
    }
  }

  return bytes;
}